

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

Float __thiscall pbrt::Curve::Area(Curve *this)

{
  size_t in_RCX;
  long lVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  span<const_pbrt::Point3<float>_> cp;
  array<pbrt::Point3<float>,_4> cpObj;
  undefined8 uStack_80;
  float afStack_78 [4];
  array<pbrt::Point3<float>,_4> local_68;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  uStack_80 = 0x239826;
  cp.n = in_RCX;
  cp.ptr = (Point3<float> *)0x4;
  CubicBezierControlPoints<pbrt::Point3<float>>
            (&local_68,(pbrt *)this->common->cpObj,cp,this->uMin,this->uMax);
  local_18 = ZEXT416((uint)this->common->width[0]);
  local_28 = ZEXT416((uint)this->common->width[1]);
  local_38._0_4_ = this->uMin;
  local_38._4_4_ = this->uMax;
  uStack_30 = 0;
  lVar1 = 0x14;
  afStack_78[3] = 0.0;
  do {
    fVar2 = *(float *)((long)afStack_78 + lVar1) - *(float *)((long)local_68.values + lVar1 + -4);
    auVar5 = ZEXT416((uint)(*(float *)((long)afStack_78 + lVar1 + -4) -
                           *(float *)((long)afStack_78 + lVar1 + 8)));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),auVar5,auVar5);
    auVar3 = ZEXT416((uint)(*(float *)((long)afStack_78 + lVar1 + 4) -
                           *(float *)((long)&local_68.values[0].super_Tuple3<pbrt::Point3,_float>.x
                                     + lVar1)));
    auVar5 = vfmadd231ss_fma(auVar5,auVar3,auVar3);
    if (auVar5._0_4_ < 0.0) {
      uStack_80 = 0x23989f;
      fVar2 = sqrtf(auVar5._0_4_);
    }
    else {
      auVar5 = vsqrtss_avx(auVar5,auVar5);
      fVar2 = auVar5._0_4_;
    }
    afStack_78[3] = afStack_78[3] + fVar2;
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x38);
  auVar3._8_4_ = 0x3f800000;
  auVar3._0_8_ = 0x3f8000003f800000;
  auVar3._12_4_ = 0x3f800000;
  auVar5._8_8_ = uStack_30;
  auVar5._0_8_ = local_38;
  auVar5 = vsubps_avx(auVar3,auVar5);
  auVar4._0_4_ = (float)local_28._0_4_ * (float)local_38;
  auVar4._4_4_ = (float)local_28._0_4_ * (float)((ulong)local_38 >> 0x20);
  auVar4._8_4_ = (float)local_28._0_4_ * (float)uStack_30;
  auVar4._12_4_ = (float)local_28._0_4_ * (float)((ulong)uStack_30 >> 0x20);
  auVar6._4_4_ = local_18._0_4_;
  auVar6._0_4_ = local_18._0_4_;
  auVar6._8_4_ = local_18._0_4_;
  auVar6._12_4_ = local_18._0_4_;
  auVar5 = vfmadd213ps_fma(auVar6,auVar5,auVar4);
  auVar5 = vhaddps_avx(auVar5,auVar5);
  return auVar5._0_4_ * 0.5 * afStack_78[3];
}

Assistant:

Float Curve::Area() const {
    pstd::array<Point3f, 4> cpObj =
        CubicBezierControlPoints(pstd::MakeConstSpan(common->cpObj), uMin, uMax);
    Float width0 = Lerp(uMin, common->width[0], common->width[1]);
    Float width1 = Lerp(uMax, common->width[0], common->width[1]);
    Float avgWidth = (width0 + width1) * 0.5f;
    Float approxLength = 0.f;
    for (int i = 0; i < 3; ++i)
        approxLength += Distance(cpObj[i], cpObj[i + 1]);
    return approxLength * avgWidth;
}